

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O3

int64_t GmfOpenMesh(char *FilNam,int mod,...)

{
  __jmp_buf_tag *__env;
  char *__dest;
  double *pdVar1;
  int iVar2;
  int iVar3;
  GmfMshSct *msh;
  size_t sVar4;
  char *pcVar5;
  FILE *pFVar6;
  long lVar7;
  long lVar8;
  ushort **ppuVar9;
  int64_t __off;
  uint uVar10;
  int *in_RCX;
  int *in_RDX;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  va_list VarArg;
  int KwdCod;
  int local_8d8;
  int local_8d0;
  char local_838;
  char cStack_837;
  char cStack_836;
  char cStack_835;
  char cStack_834;
  char cStack_833;
  char cStack_832;
  char cStack_831;
  undefined2 uStack_830;
  char cStack_82e;
  char cStack_82d;
  char cStack_82c;
  char cStack_82b;
  char cStack_82a;
  char cStack_829;
  char cStack_828;
  char cStack_827;
  char cStack_826;
  char cStack_825;
  char cStack_824;
  int local_438 [258];
  
  msh = (GmfMshSct *)calloc(1,0x303710);
  if (msh != (GmfMshSct *)0x0) {
    __env = msh->err;
    iVar2 = _setjmp((__jmp_buf_tag *)__env);
    if (iVar2 == 0) {
      sVar4 = strlen(FilNam);
      if (sVar4 - 0x3f9 < 0xfffffffffffffc00) {
        longjmp((__jmp_buf_tag *)__env,-4);
      }
      __dest = msh->FilNam;
      strcpy(__dest,FilNam);
      msh->mod = mod;
      pdVar1 = msh->DblBuf;
      msh->buf = (char *)pdVar1;
      msh->FltBuf = (float *)pdVar1;
      msh->IntBuf = (int *)pdVar1;
      pcVar5 = strstr(__dest,".meshb");
      uVar10 = 6;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = strstr(__dest,".mesh");
        uVar10 = 5;
        if (pcVar5 == (char *)0x0) {
          pcVar5 = strstr(__dest,".solb");
          uVar10 = 10;
          if (pcVar5 == (char *)0x0) {
            pcVar5 = strstr(__dest,".sol");
            uVar10 = 9;
            if (pcVar5 == (char *)0x0) {
              longjmp((__jmp_buf_tag *)__env,-5);
            }
          }
        }
      }
      msh->typ = msh->typ | uVar10;
      if (mod == 2) {
        msh->cod = 1;
        local_8d8 = (int)in_RDX;
        msh->ver = local_8d8;
        local_8d0 = (int)in_RCX;
        msh->dim = local_8d0;
        if (msh->ver - 5U < 0xfffffffc) {
          longjmp((__jmp_buf_tag *)__env,-0x12);
        }
        if ((msh->dim & 0xfffffffeU) != 2) {
          longjmp((__jmp_buf_tag *)__env,-0x14);
        }
        msh->FltSiz = (uint)(msh->ver != 1) * 0x20 + 0x20;
        iVar2 = msh->typ;
        pFVar6 = fopen(__dest,"wb");
        msh->hdl = (FILE *)pFVar6;
        if ((iVar2 & 2) == 0) {
          if (pFVar6 == (FILE *)0x0) {
            longjmp((__jmp_buf_tag *)__env,-0x17);
          }
        }
        else if (pFVar6 == (FILE *)0x0) {
          longjmp((__jmp_buf_tag *)__env,-0x16);
        }
        if ((msh->typ & 1) == 0) {
          RecWrd(msh,&msh->cod);
          RecWrd(msh,&msh->ver);
          GmfSetKwd((int64_t)msh,3,0);
          RecWrd(msh,msh);
        }
        else {
          fprintf(pFVar6,"%s %d\n\n",GmfKwdFmt[1][0],(ulong)(uint)msh->ver);
          fprintf((FILE *)msh->hdl,"%s\n%d\n",GmfKwdFmt[3][0],(ulong)(uint)msh->dim);
        }
LAB_0010a5b1:
        msh->SolTypSiz[1] = 1;
        iVar2 = msh->dim;
        msh->SolTypSiz[2] = iVar2;
        msh->SolTypSiz[3] = (iVar2 + -1) * iVar2;
        msh->SolTypSiz[4] = iVar2 * iVar2;
        return (int64_t)msh;
      }
      if (mod == 1) {
        iVar2 = msh->typ;
        pFVar6 = fopen(__dest,"rb");
        msh->hdl = (FILE *)pFVar6;
        if ((iVar2 & 2) == 0) {
          if (pFVar6 == (FILE *)0x0) {
            longjmp((__jmp_buf_tag *)__env,-0xd);
          }
          do {
            iVar2 = __isoc99_fscanf(msh->hdl,"%100s",&local_838);
            if (iVar2 == -1) {
              longjmp((__jmp_buf_tag *)__env,-0xe);
            }
            auVar11[0] = -(cStack_833 == 'e');
            auVar11[1] = -(cStack_832 == 'r');
            auVar11[2] = -(cStack_831 == 's');
            auVar11[3] = -((char)uStack_830 == 'i');
            auVar11[4] = -(uStack_830._1_1_ == 'o');
            auVar11[5] = -(cStack_82e == 'n');
            auVar11[6] = -(cStack_82d == 'F');
            auVar11[7] = -(cStack_82c == 'o');
            auVar11[8] = -(cStack_82b == 'r');
            auVar11[9] = -(cStack_82a == 'm');
            auVar11[10] = -(cStack_829 == 'a');
            auVar11[0xb] = -(cStack_828 == 't');
            auVar11[0xc] = -(cStack_827 == 't');
            auVar11[0xd] = -(cStack_826 == 'e');
            auVar11[0xe] = -(cStack_825 == 'd');
            auVar11[0xf] = -(cStack_824 == '\0');
            auVar12[0] = -(local_838 == 'M');
            auVar12[1] = -(cStack_837 == 'e');
            auVar12[2] = -(cStack_836 == 's');
            auVar12[3] = -(cStack_835 == 'h');
            auVar12[4] = -(cStack_834 == 'V');
            auVar12[5] = -(cStack_833 == 'e');
            auVar12[6] = -(cStack_832 == 'r');
            auVar12[7] = -(cStack_831 == 's');
            auVar12[8] = -((char)uStack_830 == 'i');
            auVar12[9] = -(uStack_830._1_1_ == 'o');
            auVar12[10] = -(cStack_82e == 'n');
            auVar12[0xb] = -(cStack_82d == 'F');
            auVar12[0xc] = -(cStack_82c == 'o');
            auVar12[0xd] = -(cStack_82b == 'r');
            auVar12[0xe] = -(cStack_82a == 'm');
            auVar12[0xf] = -(cStack_829 == 'a');
            auVar12 = auVar12 & auVar11;
          } while ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) != 0xffff);
          iVar2 = __isoc99_fscanf(msh->hdl,"%d",&msh->ver);
          if (iVar2 != 1) {
LAB_0010a1b5:
            longjmp((__jmp_buf_tag *)__env,-1);
          }
          if (msh->ver - 5U < 0xfffffffc) {
            longjmp((__jmp_buf_tag *)__env,-0xf);
          }
          do {
            iVar2 = __isoc99_fscanf(msh->hdl,"%100s",&local_838);
            if (iVar2 == -1) {
              longjmp((__jmp_buf_tag *)__env,-0x10);
            }
          } while (uStack_830 != 0x6e ||
                   CONCAT17(cStack_831,
                            CONCAT16(cStack_832,
                                     CONCAT15(cStack_833,
                                              CONCAT14(cStack_834,
                                                       CONCAT13(cStack_835,
                                                                CONCAT12(cStack_836,
                                                                         CONCAT11(cStack_837,
                                                                                  local_838)))))))
                   != 0x6f69736e656d6944);
          iVar2 = __isoc99_fscanf(msh->hdl,"%d",msh);
          if (iVar2 != 1) goto LAB_0010a1b5;
        }
        else {
          if (pFVar6 == (FILE *)0x0) {
            longjmp((__jmp_buf_tag *)__env,-8);
          }
          sVar4 = fread(&msh->cod,4,1,pFVar6);
          if (sVar4 != 1) {
            longjmp((__jmp_buf_tag *)__env,-3);
          }
          iVar2 = msh->cod;
          if ((iVar2 != 1) && (iVar2 != 0x1000000)) {
            longjmp((__jmp_buf_tag *)__env,-9);
          }
          ScaWrd(msh,&msh->ver);
          if (msh->ver - 5U < 0xfffffffc) {
            longjmp((__jmp_buf_tag *)__env,-10);
          }
          ScaWrd(msh,&local_838);
          if (CONCAT13(cStack_835,CONCAT12(cStack_836,CONCAT11(cStack_837,local_838))) != 3) {
            longjmp((__jmp_buf_tag *)__env,-0xc);
          }
          GetPos(msh);
          ScaWrd(msh,msh);
        }
        if ((msh->dim & 0xfffffffeU) != 2) {
          longjmp((__jmp_buf_tag *)__env,-0x11);
        }
        *in_RDX = msh->ver;
        *in_RCX = msh->dim;
        msh->FltSiz = (uint)(msh->ver != 1) * 0x20 + 0x20;
        uVar10 = msh->typ;
        if ((uVar10 & 1) == 0) {
          lVar7 = ftell((FILE *)msh->hdl);
          iVar2 = fseek((FILE *)msh->hdl,0,2);
          if ((uVar10 & 2) == 0) {
            if (iVar2 != 0) {
              longjmp((__jmp_buf_tag *)__env,-0x22);
            }
            lVar8 = ftell((FILE *)msh->hdl);
            iVar2 = fseek((FILE *)msh->hdl,lVar7,0);
            if (iVar2 != 0) {
              longjmp((__jmp_buf_tag *)__env,-0x23);
            }
          }
          else {
            if (iVar2 != 0) {
              longjmp((__jmp_buf_tag *)__env,-0x20);
            }
            lVar8 = ftell((FILE *)msh->hdl);
            iVar2 = fseek((FILE *)msh->hdl,lVar7,0);
            if (iVar2 != 0) {
              longjmp((__jmp_buf_tag *)__env,-0x21);
            }
          }
          lVar7 = -1;
          do {
            ScaWrd(msh,local_438);
            __off = GetPos(msh);
            iVar2 = local_438[0];
            if (lVar8 < __off) {
              longjmp((__jmp_buf_tag *)__env,-0x18);
            }
            if (__off <= lVar7 && __off != 0) {
              longjmp((__jmp_buf_tag *)__env,-0x1e);
            }
            if (local_438[0] - 1U < 0xf0) {
              ScaKwdHdr(msh,local_438[0]);
            }
            if (__off == 0) break;
            iVar3 = fseek((FILE *)msh->hdl,__off,0);
            if (iVar3 != 0) {
              longjmp((__jmp_buf_tag *)__env,-0x19);
            }
            lVar7 = __off;
          } while (iVar2 != 0x36);
        }
        else {
          iVar2 = __isoc99_fscanf(msh->hdl,"%100s",local_438);
          if (iVar2 != -1) {
            ppuVar9 = __ctype_b_loc();
            do {
              if ((*(byte *)((long)*ppuVar9 + (long)(char)local_438[0] * 2 + 1) & 4) == 0) {
                if ((char)local_438[0] == '#') {
                  do {
                    iVar2 = fgetc((FILE *)msh->hdl);
                    if (iVar2 == 10) break;
                  } while (iVar2 != -1);
                }
              }
              else {
                iVar2 = 1;
                lVar7 = 0x18;
                do {
                  iVar3 = strcmp((char *)local_438,*(char **)((long)GmfKwdFmt[0] + lVar7));
                  if (iVar3 == 0) {
                    ScaKwdHdr(msh,iVar2);
                    break;
                  }
                  iVar2 = iVar2 + 1;
                  lVar7 = lVar7 + 0x18;
                } while (lVar7 != 0x1698);
              }
              iVar2 = __isoc99_fscanf(msh->hdl,"%100s",local_438);
            } while (iVar2 != -1);
          }
        }
        goto LAB_0010a5b1;
      }
    }
    else {
      if ((FILE *)msh->hdl != (FILE *)0x0) {
        fclose((FILE *)msh->hdl);
      }
      if (msh->FilDes != 0) {
        close(msh->FilDes);
      }
    }
    free(msh);
  }
  return 0;
}

Assistant:

int64_t GmfOpenMesh(const char *FilNam, int mod, ...)
{
   int      KwdCod, res, *PtrVer, *PtrDim, err;
   int64_t  MshIdx;
   char     str[ GmfStrSiz ];
   va_list  VarArg;
   GmfMshSct *msh;

   /*---------------------*/
   /* MESH STRUCTURE INIT */
   /*---------------------*/

   if(!(msh = calloc(1, sizeof(GmfMshSct))))
      return(0);

   MshIdx = (int64_t)msh;

   // Save the current stack environment for longjmp
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      if(msh->hdl != NULL)
         fclose(msh->hdl);

      if(msh->FilDes != 0)
#ifdef GMF_WINDOWS
         _close(msh->FilDes);
#else
         close(msh->FilDes);
#endif

      free(msh);
      return(0);
   }

   // Copy the FilNam into the structure
   if(strlen(FilNam) + 7 >= GmfStrSiz)
      longjmp(msh->err, -4);

   strcpy(msh->FilNam, FilNam);

   // Store the opening mod (read or write) and guess
   // the filetype (binary or ascii) depending on the extension
   msh->mod = mod;
   msh->buf = (void *)msh->DblBuf;
   msh->FltBuf = (void *)msh->DblBuf;
   msh->IntBuf = (void *)msh->DblBuf;

   if(strstr(msh->FilNam, ".meshb"))
      msh->typ |= (Bin | MshFil);
   else if(strstr(msh->FilNam, ".mesh"))
      msh->typ |= (Asc | MshFil);
   else if(strstr(msh->FilNam, ".solb"))
      msh->typ |= (Bin | SolFil);
   else if(strstr(msh->FilNam, ".sol"))
      msh->typ |= (Asc | SolFil);
   else
      longjmp(msh->err, -5);

   // Open the file in the required mod and initialize the mesh structure
   if(msh->mod == GmfRead)
   {

      /*-----------------------*/
      /* OPEN FILE FOR READING */
      /*-----------------------*/

      va_start(VarArg, mod);
      PtrVer = va_arg(VarArg, int *);
      PtrDim = va_arg(VarArg, int *);
      va_end(VarArg);

      // Read the endian coding tag, the mesh version
      // and the mesh dimension (mandatory kwd)
      if(msh->typ & Bin)
      {
         // Create the name string and open the file
#ifdef WITH_GMF_AIO
         // [Bruno] added binary flag (necessary under Windows)
         msh->FilDes = open(msh->FilNam, OPEN_READ_FLAGS, OPEN_READ_MODE);

         if(msh->FilDes <= 0)
            longjmp(msh->err, -6);

         // Read the endian coding tag
         if(read(msh->FilDes, &msh->cod, WrdSiz) != WrdSiz)
            longjmp(msh->err, -7);
#else
         // [Bruno] added binary flag (necessary under Windows)
         if(!(msh->hdl = fopen(msh->FilNam, "rb")))
            longjmp(msh->err, -8);

         // Read the endian coding tag
         safe_fread(&msh->cod, WrdSiz, 1, msh->hdl, msh->err);
#endif

         // Read the mesh version and the mesh dimension (mandatory kwd)
         if( (msh->cod != 1) && (msh->cod != 16777216) )
            longjmp(msh->err, -9);

         ScaWrd(msh, (unsigned char *)&msh->ver);

         if( (msh->ver < 1) || (msh->ver > 4) )
            longjmp(msh->err, -10);

         if( (msh->ver >= 3) && (sizeof(int64_t) != 8) )
            longjmp(msh->err, -11);

         ScaWrd(msh, (unsigned char *)&KwdCod);

         if(KwdCod != GmfDimension)
            longjmp(msh->err, -12);

         GetPos(msh);
         ScaWrd(msh, (unsigned char *)&msh->dim);
      }
      else
      {
         // Create the name string and open the file
         if(!(msh->hdl = fopen(msh->FilNam, "rb")))
            longjmp(msh->err, -13);

         do
         {
            res = fscanf(msh->hdl, "%100s", str);
         }while( (res != EOF) && strcmp(str, "MeshVersionFormatted") );

         if(res == EOF)
            longjmp(msh->err, -14);

         safe_fscanf(msh->hdl, "%d", &msh->ver, msh->err);

         if( (msh->ver < 1) || (msh->ver > 4) )
            longjmp(msh->err, -15);

         do
         {
            res = fscanf(msh->hdl, "%100s", str);
         }while( (res != EOF) && strcmp(str, "Dimension") );

         if(res == EOF)
            longjmp(msh->err, -16);

         safe_fscanf(msh->hdl, "%d", &msh->dim, msh->err);
      }

      if( (msh->dim != 2) && (msh->dim != 3) )
         longjmp(msh->err, -17);

      (*PtrVer) = msh->ver;
      (*PtrDim) = msh->dim;

      // Set default real numbers size
      if(msh->ver == 1)
         msh->FltSiz = 32;
      else
         msh->FltSiz = 64;

      /*------------*/
      /* KW READING */
      /*------------*/

      // Read the list of kw present in the file
      if(!ScaKwdTab(msh))
         return(0);

      // Preset solution entities sizes
      msh->SolTypSiz[ GmfSca    ] = 1;
      msh->SolTypSiz[ GmfVec    ] = msh->dim;
      msh->SolTypSiz[ GmfSymMat ] = msh->dim * (msh->dim - 1);
      msh->SolTypSiz[ GmfMat    ] = msh->dim * msh->dim;

      return(MshIdx);
   }
   else if(msh->mod == GmfWrite)
   {

      /*-----------------------*/
      /* OPEN FILE FOR WRITING */
      /*-----------------------*/

      msh->cod = 1;

      // Check if the user provided a valid version number and dimension
      va_start(VarArg, mod);
      msh->ver = va_arg(VarArg, int);
      msh->dim = va_arg(VarArg, int);
      va_end(VarArg);

      if( (msh->ver < 1) || (msh->ver > 4) )
         longjmp(msh->err, -18);

      if( (msh->ver >= 3) && (sizeof(int64_t) != 8) )
         longjmp(msh->err, -19);

      if( (msh->dim != 2) && (msh->dim != 3) )
         longjmp(msh->err, -20);

      // Set default real numbers size
      if(msh->ver == 1)
         msh->FltSiz = 32;
      else
         msh->FltSiz = 64;

      // Create the mesh file
      if(msh->typ & Bin) 
      {
         /* 
          * [Bruno] replaced previous call to creat():
          * with a call to open(), because Windows needs the
          * binary flag to be specified.
          */
#ifdef WITH_GMF_AIO
         msh->FilDes = open(msh->FilNam, OPEN_WRITE_FLAGS, OPEN_WRITE_MODE);

         if(msh->FilDes <= 0)
            longjmp(msh->err, -21);
#else
         if(!(msh->hdl = fopen(msh->FilNam, "wb")))
            longjmp(msh->err, -22);
#endif
      }
      else if(!(msh->hdl = fopen(msh->FilNam, "wb")))
         longjmp(msh->err, -23);


      /*------------*/
      /* KW WRITING */
      /*------------*/

      // Write the mesh version and dimension
      if(msh->typ & Asc)
      {
         fprintf(msh->hdl, "%s %d\n\n",
               GmfKwdFmt[ GmfVersionFormatted ][0], msh->ver);
         fprintf(msh->hdl, "%s\n%d\n",
               GmfKwdFmt[ GmfDimension ][0], msh->dim);
      }
      else
      {
         RecWrd(msh, (unsigned char *)&msh->cod);
         RecWrd(msh, (unsigned char *)&msh->ver);
         GmfSetKwd(MshIdx, GmfDimension, 0);
         RecWrd(msh, (unsigned char *)&msh->dim);
      }

      // Preset solution entities sizes
      msh->SolTypSiz[ GmfSca    ] = 1;
      msh->SolTypSiz[ GmfVec    ] = msh->dim;
      msh->SolTypSiz[ GmfSymMat ] = msh->dim * (msh->dim - 1);
      msh->SolTypSiz[ GmfMat    ] = msh->dim * msh->dim;

      return(MshIdx);
   }
   else
   {
      free(msh);
      return(0);
   }
}